

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TSymbol::TSymbol(TSymbol *this,TSymbol *copyOf)

{
  char *pcVar1;
  TString *pTVar2;
  TSymbol *copyOf_local;
  TSymbol *this_local;
  
  this->_vptr_TSymbol = (_func_int **)&PTR___cxa_pure_virtual_013a9b88;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(copyOf->name);
  pTVar2 = NewPoolTString_abi_cxx11_(pcVar1);
  this->name = pTVar2;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(copyOf->mangledName);
  pTVar2 = NewPoolTString_abi_cxx11_(pcVar1);
  this->mangledName = pTVar2;
  this->uniqueId = copyOf->uniqueId;
  this->writable = true;
  return;
}

Assistant:

TSymbol::TSymbol(const TSymbol& copyOf)
{
    name = NewPoolTString(copyOf.name->c_str());
    mangledName = NewPoolTString(copyOf.mangledName->c_str());
    uniqueId = copyOf.uniqueId;
    writable = true;
}